

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetTxInRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this,uint32_t index)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ByteData local_48;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xb0b,"GetTxInRecordKeyList");
  pvVar1 = this->wally_psbt_pointer_;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *(long *)((long)pvVar1 + 0x10);
  if (*(long *)(lVar2 + 0x80 + (ulong)index * 0x110) != 0) {
    lVar2 = lVar2 + (ulong)index * 0x110;
    lVar4 = 8;
    uVar5 = 0;
    do {
      lVar3 = *(long *)(lVar2 + 0x78);
      ByteData::ByteData(&local_48,*(uint8_t **)(lVar3 + -8 + lVar4),*(uint32_t *)(lVar3 + lVar4));
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_48);
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < *(ulong *)(lVar2 + 0x80));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetTxInRecordKeyList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  auto input = &psbt_pointer->inputs[index];
  for (size_t idx = 0; idx < input->unknowns.num_items; ++idx) {
    auto item = &input->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}